

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  leaf_t leaf;
  uint8_t uVar1;
  uint8_t uVar2;
  roaring64_bitmap_t *leaf_00;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  bool bVar4;
  leaf_t result_leaf;
  container_t *container2;
  uint8_t typecode2;
  container_t *container1;
  uint8_t typecode1;
  leaf_t leaf2;
  leaf_t *leaf1;
  int compare_result;
  _Bool it2_present;
  _Bool it1_present;
  art_iterator_t it2;
  art_iterator_t it1;
  roaring64_bitmap_t *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  uint8_t in_stack_fffffffffffffe67;
  roaring64_bitmap_t *in_stack_fffffffffffffe68;
  roaring64_bitmap_t *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  uint8_t in_stack_fffffffffffffe7f;
  container_t *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 uVar5;
  roaring64_bitmap_t *local_168;
  int local_138;
  leaf_t *local_128;
  leaf_t *local_98;
  
  if (in_RDI != in_RSI) {
    art_init_iterator(&in_stack_fffffffffffffe70->art,
                      SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0));
    art_init_iterator(&in_stack_fffffffffffffe70->art,
                      SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0));
    while (uVar5 = local_98 != (leaf_t *)0x0 || local_128 != (leaf_t *)0x0,
          local_98 != (leaf_t *)0x0 || local_128 != (leaf_t *)0x0) {
      bVar3 = local_98 != (leaf_t *)0x0;
      bVar4 = local_128 != (leaf_t *)0x0;
      local_138 = 0;
      uVar1 = in_stack_fffffffffffffe67;
      if (((bVar3) && (bVar4)) &&
         (local_138 = compare_high48((art_key_chunk_t *)
                                     CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                                     (art_key_chunk_t *)in_stack_fffffffffffffe58),
         uVar1 = in_stack_fffffffffffffe67, local_138 == 0)) {
        leaf = *local_128;
        uVar1 = get_typecode(*local_98);
        leaf_00 = (roaring64_bitmap_t *)
                  get_container((roaring64_bitmap_t *)
                                CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                                (leaf_t)in_stack_fffffffffffffe58);
        uVar2 = get_typecode(*local_98);
        if (uVar2 == '\x04') {
          in_stack_fffffffffffffe70 = leaf_00;
          in_stack_fffffffffffffe80 =
               get_container((roaring64_bitmap_t *)
                             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                             (leaf_t)in_stack_fffffffffffffe58);
          get_typecode(leaf);
          in_stack_fffffffffffffe7f = uVar1;
          local_168 = (roaring64_bitmap_t *)
                      container_or((container_t *)CONCAT17(uVar5,in_stack_fffffffffffffe88),
                                   (uint8_t)((ulong)in_stack_fffffffffffffe80 >> 0x38),
                                   (container_t *)CONCAT17(uVar1,in_stack_fffffffffffffe78),
                                   (uint8_t)((ulong)in_stack_fffffffffffffe70 >> 0x38),
                                   (uint8_t *)in_stack_fffffffffffffe68);
          uVar1 = in_stack_fffffffffffffe67;
        }
        else {
          in_stack_fffffffffffffe58 = leaf_00;
          in_stack_fffffffffffffe68 =
               (roaring64_bitmap_t *)
               get_container((roaring64_bitmap_t *)CONCAT17(uVar1,in_stack_fffffffffffffe60),
                             (leaf_t)leaf_00);
          get_typecode(leaf);
          local_168 = (roaring64_bitmap_t *)
                      container_ior((container_t *)CONCAT17(uVar5,in_stack_fffffffffffffe88),
                                    (uint8_t)((ulong)in_stack_fffffffffffffe80 >> 0x38),
                                    (container_t *)
                                    CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                    (uint8_t)((ulong)in_stack_fffffffffffffe70 >> 0x38),
                                    (uint8_t *)in_stack_fffffffffffffe68);
        }
        if (local_168 != leaf_00) {
          container_free((container_t *)CONCAT17(uVar1,in_stack_fffffffffffffe60),
                         (uint8_t)((ulong)in_stack_fffffffffffffe58 >> 0x38));
          replace_container(in_stack_fffffffffffffe70,(leaf_t *)in_stack_fffffffffffffe68,
                            (container_t *)CONCAT17(uVar1,in_stack_fffffffffffffe60),
                            (uint8_t)((ulong)in_stack_fffffffffffffe58 >> 0x38));
        }
        art_iterator_next((art_iterator_t *)0x109d5d);
        art_iterator_next((art_iterator_t *)0x109d67);
      }
      if (((bVar3) && (!bVar4)) || (local_138 < 0)) {
        art_iterator_next((art_iterator_t *)0x109d8b);
        in_stack_fffffffffffffe67 = uVar1;
      }
      else if (((!bVar3) && (bVar4)) || (in_stack_fffffffffffffe67 = uVar1, 0 < local_138)) {
        copy_leaf_container(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                            CONCAT17(uVar1,in_stack_fffffffffffffe60));
        art_iterator_insert((art_iterator_t *)CONCAT17(uVar1,in_stack_fffffffffffffe60),
                            (art_key_chunk_t *)in_stack_fffffffffffffe58,0x109dde);
        art_iterator_next((art_iterator_t *)0x109de8);
        in_stack_fffffffffffffe67 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t typecode1 = get_typecode(*leaf1);
                container_t *container1 = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (get_typecode(*leaf1) == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(container1, typecode1,
                                              get_container(r2, leaf2),
                                              get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_ior(container1, typecode1,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                }
                if (container2 != container1) {
                    container_free(container1, typecode1);
                    replace_container(r1, leaf1, container2, typecode2);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, r1, (leaf_t)*it2.value);
            art_iterator_insert(&it1, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
}